

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

int __thiscall OIDType::fromBuffer(OIDType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  
  uVar1 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar1) {
    if (buf[uVar1] == '+') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                (&this->data,(long)(this->super_BER_CONTAINER)._length);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->data,buf + uVar1,
                 buf + uVar1 + (this->super_BER_CONTAINER)._length);
      this->valid = true;
      uVar1 = (this->super_BER_CONTAINER)._length + 2;
    }
    else {
      uVar1 = 0xffffffef;
    }
  }
  return uVar1;
}

Assistant:

int OIDType::fromBuffer(const uint8_t *buf, size_t max_len){
    int j = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(j);
    const uint8_t* dataPtr = buf + j;

    if(*dataPtr != 0x2b) return SNMP_BUFFER_ERROR_INVALID_OID;
    this->data.reserve(_length);
    this->data.assign(dataPtr, dataPtr + _length);
    this->valid = true;

    return _length + 2;
}